

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O1

void __thiscall
Region_UnderSizedFile_Test::~Region_UnderSizedFile_Test(Region_UnderSizedFile_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (Region, UnderSizedFile) {
    constexpr std::size_t file_size = 16;
    constexpr std::size_t region_size = 32;

    auto sp = this->make_array (file_size);
    auto file = std::make_shared<pstore::file::in_memory> (sp, file_size, file_size);

    pstore::region::mem_based_factory factory (file, region_size, region_size);
    auto result = factory.init ();

    ASSERT_EQ (1U, result.size ());

    auto const & region0 = *(result.at (0));
    EXPECT_EQ (sp, region0.data ());
    EXPECT_EQ (0U, region0.offset ());
    EXPECT_EQ (region_size, region0.size ());
    EXPECT_TRUE (region0.is_writable ());
}